

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++:1305:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:1305:17)>
             *this)

{
  ThreadId *pTVar1;
  ThreadId *this_00;
  bool bVar2;
  DebugExpression<bool> _kjCondition_2;
  ThreadId id3;
  DebugComparison<kj::ThreadId_&,_kj::ThreadId_&> _kjCondition;
  Fault f;
  ThreadId local_510 [3];
  undefined1 local_4f8 [16];
  char *local_4e8;
  undefined1 *local_4e0;
  bool local_4d8;
  Fault local_360 [102];
  
  local_510[0] = ThreadId::current();
  ThreadId::assertCurrentThread(local_510);
  local_4f8._0_8_ = (this->f).id1;
  bVar2 = ((ThreadId *)local_4f8._0_8_)->id == local_510[0].id;
  local_4e8 = " != ";
  local_4e0 = &DAT_00000005;
  local_4d8 = !bVar2;
  local_4f8._8_8_ = local_510;
  if (bVar2) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ThreadId&,kj::ThreadId&>&>
              (local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x51c,FAILED,"id1 != id3","_kjCondition,",
               (DebugComparison<kj::ThreadId_&,_kj::ThreadId_&> *)local_4f8);
    _::Debug::Fault::fatal(local_360);
  }
  pTVar1 = (this->f).id2;
  local_4d8 = pTVar1->id != local_510[0].id;
  local_4e8 = " != ";
  local_4e0 = &DAT_00000005;
  if (local_4d8) {
    this_00 = (ThreadId *)local_4f8._0_8_;
    local_4f8._0_8_ = pTVar1;
    ThreadId::assertCurrentThread(this_00);
    local_4f8._0_8_ = local_4f8._0_8_ & 0xffffffffffffff00;
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x51f,ERROR,"\"code did not throw: \" \"id1.assertCurrentThread()\"",
                 (char (*) [46])"code did not throw: id1.assertCurrentThread()");
    }
    if (local_4f8[0] == '\x01') {
      Exception::~Exception((Exception *)(local_4f8 + 8));
    }
    return;
  }
  local_4f8._0_8_ = pTVar1;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ThreadId&,kj::ThreadId&>&>
            (local_360,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
             ,0x51d,FAILED,"id2 != id3","_kjCondition,",
             (DebugComparison<kj::ThreadId_&,_kj::ThreadId_&> *)local_4f8);
  _::Debug::Fault::fatal(local_360);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }